

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_add_optionv(cargo_t ctx,cargo_option_flags_t flags,char *optnames,char *description,
                     char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  cargo_fmt_token_t cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  cargo_bool_acc_op_t cVar6;
  size_t sVar7;
  char *pcVar8;
  char **ppcVar9;
  char *pcVar10;
  char **ppcVar11;
  cargo_opt_t *pcVar12;
  char *pcVar13;
  undefined8 *puVar14;
  int *piVar15;
  uint *puVar16;
  long lVar17;
  size_t **ppsVar18;
  __va_list_tag *extraout_RDX;
  __va_list_tag *extraout_RDX_00;
  __va_list_tag *extraout_RDX_01;
  __va_list_tag *extraout_RDX_02;
  __va_list_tag *p_Var19;
  ulong uVar20;
  size_t *count;
  ulong uVar21;
  size_t sVar22;
  char ***s;
  bool bVar23;
  cargo_fmt_scanner_t local_b0;
  size_t optcount;
  char *mutex_grpname;
  char *local_70;
  char **optname_list;
  char **local_60;
  cargo_t local_58;
  ulong local_50;
  cargo_option_flags_t local_44;
  char **local_40;
  char *local_38;
  
  optcount = 0;
  optname_list = (char **)0x0;
  mutex_grpname = (char *)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1728,
                  "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                 );
  }
  if (((ctx->flags & CARGO_DEFAULT_LITERALS) != 0 || (flags & CARGO_OPT_DEFAULT_LITERAL) != 0) &&
      (ctx->flags & CARGO_AUTOCLEAN) == 0) {
    return -1;
  }
  local_70 = (char *)0x0;
  local_40 = (char **)fmt;
  local_38 = description;
  sVar7 = strspn(optnames," \t");
  pcVar13 = optnames + sVar7;
  if (optnames[sVar7] == '<') {
    pcVar8 = strchr(pcVar13,0x3e);
    if (pcVar8 == (char *)0x0) {
      return -1;
    }
    local_b0.fmt = cargo_strndup(pcVar13 + 1,(long)(int)(pcVar8 + ~(ulong)pcVar13));
    if ((char **)local_b0.fmt == (char **)0x0) {
      return -1;
    }
    local_44 = flags;
    ppcVar9 = _cargo_split(local_b0.fmt,",",&local_50);
    local_60 = ppcVar9;
    if (local_50 < 3 && ppcVar9 != (char **)0x0) {
      local_58 = ctx;
      for (uVar20 = 0; uVar20 < local_50; uVar20 = uVar20 + 1) {
        pcVar10 = ppcVar9[uVar20];
        sVar7 = strspn(pcVar10," \t");
        if (pcVar10[sVar7] == '!') {
          pcVar10 = _cargo_strdup(pcVar10 + sVar7 + 1);
          mutex_grpname = pcVar10;
        }
        else {
          pcVar10 = _cargo_strdup(pcVar10 + sVar7);
          local_70 = pcVar10;
        }
        if (pcVar10 == (char *)0x0) {
          pcVar13 = (char *)0x0;
          ctx = local_58;
          goto LAB_00107d76;
        }
      }
      pcVar13 = pcVar13 + (((long)(pcVar8 + ~(ulong)pcVar13) << 0x20) + 0x200000000 >> 0x20);
      ctx = local_58;
    }
    else {
      pcVar13 = (char *)0x0;
    }
LAB_00107d76:
    _cargo_xfree(&local_b0);
    flags = local_44;
    iVar4 = -1;
    if (pcVar13 == (char *)0x0) {
      _cargo_xfree(&local_70);
      _cargo_xfree(&mutex_grpname);
      s = &local_60;
      count = &local_50;
      goto LAB_00107f7a;
    }
    _cargo_free_str_list(&local_60,&local_50);
  }
  ppcVar9 = (char **)_cargo_strdup(pcVar13);
  local_60 = ppcVar9;
  if (ppcVar9 == (char **)0x0) {
LAB_00107f52:
    optname_list = (char **)0x0;
LAB_00107f58:
    iVar4 = -1;
    goto LAB_00107f5c;
  }
  ppcVar11 = _cargo_split((char *)ppcVar9," ",&optcount);
  local_b0.fmt = (char *)ppcVar11;
  if (((ppcVar11 == (char **)0x0) || (optcount == 0)) ||
     (iVar4 = _cargo_find_option_name(ctx,*ppcVar11,(size_t *)0x0,(size_t *)0x0), iVar4 == 0)) {
LAB_00107f39:
    _cargo_xfree(&local_60);
    _cargo_free_str_list((char ***)&local_b0,&optcount);
    goto LAB_00107f52;
  }
  pcVar13 = *ppcVar11;
  iVar4 = _cargo_starts_with_prefix(ctx,pcVar13);
  if ((iVar4 == 0) &&
     (pcVar8 = strpbrk(pcVar13,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"),
     pcVar8 != pcVar13)) goto LAB_00107f39;
  _cargo_free(ppcVar9);
  sVar22 = ctx->max_opts;
  optname_list = ppcVar11;
  if (sVar22 == 0) {
    __assert_fail("*max_opts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x44d,"int _cargo_grow_options(cargo_t, cargo_opt_t **, size_t *, size_t *)");
  }
  pcVar13 = *ppcVar11;
  pcVar12 = ctx->options;
  if (pcVar12 == (cargo_opt_t *)0x0) {
    pcVar12 = (cargo_opt_t *)_cargo_calloc(sVar22,0x128);
    ctx->options = pcVar12;
    if (pcVar12 != (cargo_opt_t *)0x0) {
      sVar22 = ctx->max_opts;
      goto LAB_00107e64;
    }
    goto LAB_00107f58;
  }
LAB_00107e64:
  uVar20 = ctx->opt_count;
  if (sVar22 <= uVar20) {
    ctx->max_opts = sVar22 * 2;
    pcVar12 = (cargo_opt_t *)_cargo_realloc(pcVar12,sVar22 * 0x250);
    if (pcVar12 == (cargo_opt_t *)0x0) goto LAB_00107f58;
    ctx->options = pcVar12;
    uVar20 = ctx->opt_count;
    ppsVar18 = &pcVar12->target_count;
    uVar21 = uVar20;
    while (bVar23 = uVar21 != 0, uVar21 = uVar21 - 1, bVar23) {
      if ((cargo_custom_f)ppsVar18[-7] != (cargo_custom_f)0x0) {
        ppsVar18[-2] = (size_t *)(ppsVar18 + -4);
        *ppsVar18 = (size_t *)(ppsVar18 + -3);
      }
      ppsVar18 = ppsVar18 + 0x25;
    }
  }
  pcVar12 = pcVar12 + uVar20;
  memset(pcVar12,0,0x128);
  ctx->opt_count = ctx->opt_count + 1;
  pcVar13 = _cargo_strdup(pcVar13);
  iVar4 = -1;
  if (pcVar13 == (char *)0x0) goto LAB_00107f5c;
  sVar22 = pcVar12->name_count;
  pcVar12->name[sVar22] = pcVar13;
  pcVar12->name_count = sVar22 + 1;
  if (local_38 != (char *)0x0) {
    pcVar13 = _cargo_strdup(local_38);
    pcVar12->description = pcVar13;
    if (pcVar13 == (char *)0x0) goto LAB_00107f5c;
  }
  if (local_70 != (char *)0x0) {
    iVar5 = cargo_group_add_option(ctx,local_70,pcVar12->name[0]);
    if (iVar5 == 0) goto LAB_00107ffd;
    goto LAB_00108655;
  }
  pcVar12->group_index = -1;
LAB_00107ffd:
  if ((mutex_grpname != (char *)0x0) &&
     (iVar5 = cargo_mutex_group_add_option(ctx,mutex_grpname,pcVar12->name[0]), iVar5 != 0))
  goto LAB_00108655;
  local_b0.next_token.column = 0;
  local_b0.next_token.token = '\0';
  local_b0.next_token._5_3_ = 0;
  local_b0.column = 0;
  local_b0._44_4_ = 0;
  local_b0.prev_token.column = 0;
  local_b0.prev_token.token = '\0';
  local_b0.prev_token._5_3_ = 0;
  local_b0.fmt = (char *)local_40;
  local_b0.start = (char *)local_40;
  local_b0.token = (cargo_fmt_token_t)((ulong)*(byte *)local_40 << 0x20);
  _cargo_fmt_next_token(&local_b0);
  if (local_b0.token.token == '.') {
    pcVar12->alloc = 0;
    _cargo_fmt_next_token(&local_b0);
    p_Var19 = extraout_RDX_00;
  }
  else {
    pcVar12->alloc = 1;
    p_Var19 = extraout_RDX;
  }
  cVar3 = local_b0.token.token;
  if (local_b0.token.token == '[') {
    pcVar12->array = 1;
    _cargo_fmt_next_token(&local_b0);
    p_Var19 = extraout_RDX_01;
    cVar3 = local_b0.token.token;
  }
  switch(cVar3) {
  case 'b':
    pcVar12->type = CARGO_BOOL;
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    pcVar12->target = (void **)*puVar14;
    _cargo_fmt_next_token(&local_b0);
    if (local_b0.token.token == '!') {
      pcVar12->bool_count = 1;
LAB_00108870:
      bVar23 = true;
      goto LAB_001081da;
    }
    if (local_b0.token.token == '&') {
      cVar6 = CARGO_BOOL_OP_AND;
LAB_001087c6:
      pcVar12->bool_acc_op = cVar6;
      pcVar12->bool_acc_count = 0;
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar16 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        puVar16 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar16 + 2;
      }
      uVar1 = *puVar16;
      pcVar12->bool_acc_max_count = (ulong)uVar1;
      piVar15 = (int *)_cargo_calloc((ulong)uVar1,4);
      pcVar12->bool_acc = piVar15;
      if (piVar15 == (int *)0x0) goto LAB_00108655;
      for (uVar20 = 0; uVar20 < pcVar12->bool_acc_max_count; uVar20 = uVar20 + 1) {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar15 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          piVar15 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar15 + 2;
        }
        pcVar12->bool_acc[uVar20] = *piVar15;
      }
    }
    else {
      if (local_b0.token.token == '+') {
        cVar6 = CARGO_BOOL_OP_PLUS;
        goto LAB_001087c6;
      }
      if (local_b0.token.token == '|') {
        cVar6 = CARGO_BOOL_OP_OR;
        goto LAB_001087c6;
      }
      if (local_b0.token.token == '_') {
        cVar6 = CARGO_BOOL_OP_STORE;
        goto LAB_001087c6;
      }
      if (local_b0.token.token == '=') {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar15 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          piVar15 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar15 + 2;
        }
        pcVar12->bool_store = *piVar15;
      }
      else {
        pcVar12->bool_store = 1;
        pcVar12->bool_count = 0;
        pcVar12->bool_acc = (int *)0x0;
        local_b0.next_token = local_b0.token;
        local_b0.fmt = (char *)((long)local_b0.prev_token.column + (long)local_b0.start);
        local_b0.token = local_b0.prev_token;
      }
    }
    goto LAB_001081d8;
  case 'c':
    if (pcVar12->alloc == 0) {
      pcVar12->alloc = 1;
    }
    pcVar12->type = CARGO_STRING;
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    pcVar12->custom = (cargo_custom_f)*puVar14;
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    pcVar12->custom_user = (void *)*puVar14;
    pcVar12->target = &pcVar12->custom_target;
    pcVar12->target_count = &pcVar12->custom_target_count;
    pcVar12->lenstr = 0;
    _cargo_fmt_next_token(&local_b0);
    cVar2 = local_b0.token;
    if (local_b0.token.token == '0') {
      pcVar12->nargs = 0;
    }
    else {
      local_b0.token = local_b0.prev_token;
      local_b0.next_token = cVar2;
      local_b0.fmt = (char *)((long)local_b0.prev_token.column + (long)local_b0.start);
      pcVar12->nargs = 1;
    }
    bVar23 = false;
    goto LAB_001081da;
  case 'd':
    pcVar12->type = CARGO_DOUBLE;
    break;
  case 'e':
  case 'g':
  case 'h':
    goto switchD_001080ee_caseD_65;
  case 'f':
    pcVar12->type = CARGO_FLOAT;
    break;
  case 'i':
    pcVar12->type = CARGO_INT;
    break;
  default:
    if (cVar3 != 'D') {
      if (cVar3 == 'L') {
        pcVar12->type = CARGO_LONGLONG;
      }
      else if (cVar3 == 'U') {
        pcVar12->type = CARGO_ULONGLONG;
      }
      else {
        if (cVar3 == 's') {
          pcVar12->type = CARGO_STRING;
          uVar1 = ap->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            puVar14 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar14 + 1;
          }
          pcVar12->target = (void **)*puVar14;
          _cargo_fmt_next_token(&local_b0);
          cVar2 = local_b0.token;
          if (local_b0.token.token == '#') {
            uVar1 = ap->gp_offset;
            if ((ulong)uVar1 < 0x29) {
              piVar15 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
              ap->gp_offset = uVar1 + 8;
            }
            else {
              piVar15 = (int *)ap->overflow_arg_area;
              ap->overflow_arg_area = piVar15 + 2;
            }
            pcVar12->lenstr = (long)*piVar15;
            goto LAB_001081d8;
          }
          pcVar12->lenstr = 0;
          local_b0.token = local_b0.prev_token;
          local_b0.next_token = cVar2;
          local_b0.fmt = (char *)((long)local_b0.prev_token.column + (long)local_b0.start);
          goto LAB_00108870;
        }
        if (cVar3 != 'u') goto switchD_001080ee_caseD_65;
        pcVar12->type = CARGO_UINT;
      }
      break;
    }
    pcVar12->array = 0;
    pcVar12->alloc = 1;
    pcVar12->type = CARGO_STRING;
    pcVar12->nargs = 0;
    pcVar12->lenstr = 0;
    pcVar12->custom = (cargo_custom_f)0x0;
    pcVar12->custom_user = (void *)0x0;
    pcVar12->target = &pcVar12->custom_target;
    pcVar12->target_count = &pcVar12->custom_target_count;
    bVar23 = false;
    goto LAB_001081da;
  }
  uVar1 = ap->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    puVar14 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar14 + 1;
  }
  pcVar12->target = (void **)*puVar14;
LAB_001081d8:
  bVar23 = true;
LAB_001081da:
  if (pcVar12->array == 0) {
    if (pcVar12->type == CARGO_BOOL) {
      pcVar12->nargs = 0;
      iVar5 = 0;
    }
    else {
      _cargo_fmt_next_token(&local_b0);
      cVar2 = local_b0.token;
      if (local_b0.token.token == '?') {
        pcVar12->nargs = -3;
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar14 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar14 + 1;
        }
        pcVar12->zero_or_one_default = (char *)*puVar14;
      }
      else {
        local_b0.token = local_b0.prev_token;
        local_b0.next_token = cVar2;
        local_b0.fmt = (char *)((long)local_b0.prev_token.column + (long)local_b0.start);
        if (bVar23) {
          pcVar12->nargs = 1;
        }
      }
      iVar5 = 0;
      if (pcVar12->type == CARGO_STRING) {
        iVar5 = pcVar12->alloc;
      }
    }
    pcVar12->alloc = iVar5;
    pcVar12->max_target_count = 1;
    goto LAB_00108630;
  }
  uVar1 = ap->gp_offset;
  if (pcVar12->custom == (cargo_custom_f)0x0) {
    if (uVar1 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    lVar17 = 0xb8;
  }
  else {
    if (uVar1 < 0x29) {
      puVar14 = (undefined8 *)((long)ap->reg_save_area + (ulong)uVar1);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    lVar17 = 0x90;
  }
  *(undefined8 *)((long)pcVar12->name + lVar17) = *puVar14;
  _cargo_fmt_next_token(&local_b0);
  if (local_b0.token.token == ']') {
    _cargo_fmt_next_token(&local_b0);
    p_Var19 = ap;
    if (pcVar12->alloc == 0) {
      if (*(byte *)local_40 != 0x2e) {
        __assert_fail("*fmt == \'.\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                      ,0x1860,
                      "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                     );
      }
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar15 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        piVar15 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar15 + 2;
      }
      iVar5 = *piVar15;
      pcVar12->max_target_count = (long)iVar5;
      if ((local_b0.token.token == '#') || (local_b0.token.token == 'N')) {
        pcVar12->nargs = iVar5;
        goto LAB_00108630;
      }
      if (local_b0.token.token == '+') {
        pcVar12->nargs = -1;
        goto LAB_00108630;
      }
      if (local_b0.token.token == '*') {
        pcVar12->nargs = -2;
        goto LAB_00108630;
      }
    }
    else {
      if (local_b0.token.token == '#') {
LAB_001083ad:
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar16 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar16 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar16 + 2;
        }
        uVar1 = *puVar16;
        pcVar12->nargs = uVar1;
        uVar20 = 0xffffffffffffffff;
        if (-1 < (int)uVar1) {
          uVar20 = (ulong)uVar1;
        }
      }
      else {
        if (local_b0.token.token == '*') {
          iVar5 = -2;
        }
        else {
          if (local_b0.token.token == 'N') goto LAB_001083ad;
          if (local_b0.token.token != '+') goto switchD_001080ee_caseD_65;
          iVar5 = -1;
        }
        pcVar12->nargs = iVar5;
        uVar20 = 0xffffffffffffffff;
      }
      pcVar12->max_target_count = uVar20;
LAB_00108630:
      _cargo_fmt_next_token(&local_b0);
      p_Var19 = extraout_RDX_02;
      if (local_b0.token.token == '\0') {
        pcVar12->flags = flags;
        pcVar12->first_parse = 1;
        cVar3 = _cargo_is_prefix(ctx,*pcVar12->name[0]);
        pcVar12->positional = (uint)(cVar3 == '\0');
        iVar5 = pcVar12->nargs;
        if (((flags & CARGO_OPT_NOT_REQUIRED) == 0) && (cVar3 == '\0')) {
          if (1 < iVar5 + 3U) {
            pcVar12->flags = flags | CARGO_OPT_REQUIRED;
            goto LAB_001086ba;
          }
        }
        else {
LAB_001086ba:
          if (iVar5 < -3) goto LAB_00108655;
        }
        if ((pcVar12->custom != (cargo_custom_f)0x0) ||
           ((pcVar12->target != (void **)0x0 &&
            ((pcVar12->target_count != (size_t *)0x0 || (iVar5 != -1 && iVar5 < 2)))))) {
          if ((iVar5 != 1) &&
             (((pcVar12->type == CARGO_STRING && (pcVar12->lenstr == 0)) && (pcVar12->alloc == 0))))
          {
            pcVar12->str_alloc_items = 1;
          }
          uVar20 = 1;
          do {
            if (optcount <= uVar20) {
              iVar4 = 0;
              goto LAB_00107f5c;
            }
            iVar5 = cargo_add_alias(ctx,*optname_list,optname_list[uVar20]);
            uVar20 = uVar20 + 1;
          } while (iVar5 == 0);
        }
        goto LAB_00108655;
      }
    }
switchD_001080ee_caseD_65:
    _cargo_invalid_format_char(ctx,pcVar12->name[0],(char *)p_Var19,&local_b0);
  }
LAB_00108655:
  _cargo_option_destroy(pcVar12);
  ctx->opt_count = ctx->opt_count - 1;
LAB_00107f5c:
  _cargo_xfree(&local_70);
  _cargo_xfree(&mutex_grpname);
  s = &optname_list;
  count = &optcount;
LAB_00107f7a:
  _cargo_free_str_list(s,count);
  return iVar4;
}

Assistant:

int cargo_add_optionv(cargo_t ctx, cargo_option_flags_t flags,
                         const char *optnames, const char *description,
                         const char *fmt, va_list ap)
{
    size_t optcount = 0;
    char **optname_list = NULL;
    int ret = -1;
    size_t i = 0;
    cargo_fmt_scanner_t s;
    cargo_opt_t *o = NULL;
    char *grpname = NULL;
    char *mutex_grpname = NULL;
    int nargs_is_set = 0;
    assert(ctx);

    CARGODBG(2, "-------- Add option \"%s\", \"%s\" --------\n", optnames, fmt);

    if ((
            (flags & CARGO_OPT_DEFAULT_LITERAL) ||
            (ctx->flags & CARGO_DEFAULT_LITERALS)
        )
        && !(ctx->flags & CARGO_AUTOCLEAN))
    {
        CARGODBG(1, "Option flag CARGO_OPT_DEFAULT_LITERAL or global flag "
                    "CARGO_DEFAULT_LITERALS must be "
                    "combined with the global flag CARGO_AUTOCLEAN "
                    "to avoid memory leak / crash.");
        return -1;
    }

    // TODO: Allow multiple mutex groups...
    if (!(optnames = _cargo_get_option_group_names(ctx, optnames,
                        &grpname, &mutex_grpname)))
    {
        CARGODBG(1, "Failed to parse group name\n");
        return -1;
    }

    CARGODBG(2, " Group: \"%s\", Optnames: \"%s\"\n", grpname, optnames);

    if (!(optname_list = _cargo_split_and_verify_option_names(ctx, optnames, &optcount)))
    {
        CARGODBG(1, "Failed to split option names \"%s\"\n", optnames);
        goto fail;
    }

    if (!(o = _cargo_option_init(ctx, optname_list[0], description)))
    {
        CARGODBG(1, "Failed to init option\n");
        goto fail;
    }

    if (grpname)
    {
        CARGODBG(2, "Add \"%s\" to group \"%s\"\n", o->name[0], grpname);

        if (cargo_group_add_option(ctx, grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to group \"%s\"\n",
                    o->name[0], grpname);
            goto fail;
        }
    }
    else
    {
        CARGODBG(2, "Add \"%s\" to default group\n", o->name[0]);
        o->group_index = -1;
    }

    if (mutex_grpname)
    {
        CARGODBG(2, "Add \"%s\" to mutex group \"%s\"\n", o->name[0], mutex_grpname);

        if (cargo_mutex_group_add_option(ctx, mutex_grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to mutex group \"%s\"",
                    o->name[0], mutex_grpname);
            goto fail;
        }
    }

    // Start parsing the format string.
    _cargo_fmt_scanner_init(&s, fmt);
    _cargo_fmt_next_token(&s);

    // Get the first token.
    if (_cargo_fmt_token(&s) == '.')
    {
        CARGODBG(2, "Static\n");
        o->alloc = 0;
        _cargo_fmt_next_token(&s);
    }
    else
    {
        o->alloc = 1;
    }

    if (_cargo_fmt_token(&s) == '[')
    {
        CARGODBG(4, "   [\n");
        o->array = 1;
        _cargo_fmt_next_token(&s);
    }

    switch (_cargo_fmt_token(&s))
    {
        //
        // !!!WARNING!!!
        // Do not attempt to refactor and put these longer cases in
        // separate functions. Passing a va_list around is dangerous.
        // This works fine on Unix, but fails randomly on Windows!
        //

        // Same as string, but the target is internal
        // and will be passed to the user specified callback.
        case 'c':
        {
            CARGODBG(4, "Custom callback\n");

            if (!o->alloc)
            {
                CARGODBG(1, "WARNING! Static '.' is ignored for a custom "
                            "callback the memory for the arguments is "
                            "allocated internally.");
                o->alloc = 1;
            }

            o->type = CARGO_STRING;
            o->custom = va_arg(ap, cargo_custom_f);
            o->custom_user = va_arg(ap, void *);

            // We use an internal target for custom variables, this will then
            // be passed on to the callback as argv and argc.
            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            o->lenstr = 0;

            if (!o->custom)
            {
                CARGODBG(2, "Warning: Got NULL custom callback pointer\n");
            }

            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // A shortcut to "[c]#", cbfunc, NULL, NULL, 0.
                // which makes a custom callback a bool flag basically.
                case '0': o->nargs = 0; break;
                default:
                {
                    _cargo_fmt_prev_token(&s);
                    o->nargs = 1;
                    break;
                }
            }

            nargs_is_set = 1;

            break;
        }
        case 'D': // D as in Dummy.
        {
            // Shortcut for: "c0", NULL, NULL;
            // That is a dummy callback. This is mostly useful
            // for using in a mutex group.
            o->array = 0;
            o->alloc = 1;
            o->type = CARGO_STRING;
            o->custom = NULL;
            o->custom_user = NULL;
            o->lenstr = 0;
            o->nargs = 0;

            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            nargs_is_set = 1;
            break;
        }
        case 's':
        {
            o->type = CARGO_STRING;
            o->target = (void *)va_arg(ap, char *);

            CARGODBG(4, "Read string\n");
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '#')
            {
                o->lenstr = (size_t)va_arg(ap, int);
                CARGODBG(4, "String length: %lu\n", o->lenstr);

                if (o->alloc)
                {
                    CARGODBG(1, "%s: WARNING! Usually restricting the size of a "
                        "string using # is only done on static strings.\n"
                        "    Are you sure you want this?\n",
                        o->name[0]);
                    CARGODBG(1, "      \"%s\"\n", s.start);
                    CARGODBG(1, "       %*s\n", s.column, "^");
                }
            }
            else
            {
                // String size not fixed.
                o->lenstr = 0;
                _cargo_fmt_prev_token(&s);
            }

            break;
        }
        case 'b':
        {
            o->type = CARGO_BOOL;
            o->target = va_arg(ap, void *);

            // Look for any modifier tokens.
            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // Read an int that will be stored in the bool value (Default 1)
                case '=': o->bool_store = va_arg(ap, int); break;
                // Count flag occurances.
                case '!': o->bool_count = 1; break;
                case '|':
                case '+':
                case '&':
                case '_':
                {
                    switch (_cargo_fmt_token(&s))
                    {
                        default:
                        case '|': o->bool_acc_op = CARGO_BOOL_OP_OR; break;
                        case '+': o->bool_acc_op = CARGO_BOOL_OP_PLUS; break;
                        case '&': o->bool_acc_op = CARGO_BOOL_OP_AND; break;
                        case '_': o->bool_acc_op = CARGO_BOOL_OP_STORE; break;
                    }

                    o->bool_acc_count = 0;
                    o->bool_acc_max_count = (size_t)va_arg(ap, unsigned int);
                    CARGODBG(3, "Bool acc max count %lu\n", o->bool_acc_max_count);

                    if (!(o->bool_acc = _cargo_calloc(o->bool_acc_max_count, sizeof(int))))
                    {
                        CARGODBG(1, "Out of memory\n");
                        goto fail;
                    }

                    for (i = 0; i < o->bool_acc_max_count; i++)
                    {
                        o->bool_acc[i] = va_arg(ap, int);
                        CARGODBG(3, "  bool acc value %lu: 0x%x\n", i, o->bool_acc[i]);
                    }
                    break;
                }
                default:
                {
                    // Got no flag modifier token.
                    o->bool_store = 1;
                    o->bool_count = 0;
                    o->bool_acc = NULL;
                    _cargo_fmt_prev_token(&s);
                }
            }

            break;
        }
        // TODO: Maybe replace target here with a union?
        case 'i': o->type = CARGO_INT;    o->target = va_arg(ap, void *); break;
        case 'd': o->type = CARGO_DOUBLE; o->target = va_arg(ap, void *); break;
        case 'u': o->type = CARGO_UINT;   o->target = va_arg(ap, void *); break;
        case 'f': o->type = CARGO_FLOAT;  o->target = va_arg(ap, void *); break;
        case 'L': o->type = CARGO_LONGLONG;   o->target = va_arg(ap, void *); break;
        case 'U': o->type = CARGO_ULONGLONG;  o->target = va_arg(ap, void *); break;
        default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);goto fail;
    }

    if (o->array)
    {
        // Custom callbacks uses an internal target and count.
        // However we still return the count in a separate
        // user specified value for arrays.
        if (o->custom)
        {
            o->custom_user_count = va_arg(ap, size_t *);
        }
        else
        {
            // This is where we return the number of arguments
            // we have parsed for this option.
            o->target_count = va_arg(ap, size_t *);
        }

        _cargo_fmt_next_token(&s);

        if (_cargo_fmt_token(&s) != ']')
        {
            CARGODBG(1, "%s: Expected ']'\n", o->name[0]);
            CARGODBG(1, "      \"%s\"\n", fmt);
            CARGODBG(1, "        %*s\n", s.column, "^");
            goto fail;
        }

        _cargo_fmt_next_token(&s);

        if (o->alloc)
        {
            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = va_arg(ap, int); break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }

            // By default "nargs" is the max number of arguments the option should parse.
            o->max_target_count = (o->nargs >= 0) ? o->nargs : (size_t)(-1);
        }
        else
        {
            assert(*fmt == '.');
            // If we have a static array. For example:
            // "int val[4];"
            // The max target count must still always be specified
            // if we use "+" or "*" when in static mode.
            o->max_target_count = va_arg(ap, int);

            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = o->max_target_count; break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }
        }
    }
    else
    {
        // Non-array.

        if (o->type == CARGO_BOOL)
        {
            // BOOLs never have arguments.
            o->nargs = 0;
        }
        else
        {
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '?')
            {
                o->nargs = CARGO_NARGS_ZERO_OR_ONE;
                o->zero_or_one_default = va_arg(ap, char *);
            }
            else
            {
                _cargo_fmt_prev_token(&s);

                if (!nargs_is_set)
                {
                    o->nargs = 1;
                }
            }
        }

        // Never allocate single values (unless it's a string).
        o->alloc = (o->type != CARGO_STRING) ? 0 : o->alloc;
        o->max_target_count = 1;
    }

    _cargo_fmt_next_token(&s);

    if (_cargo_fmt_token(&s) != '\0')
    {
        _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
        CARGODBG(1, "Got garbage at end of format string\n");
        goto fail;
    }

    o->flags = flags;
    o->first_parse = 1;

    // Check if the option has a prefix
    // (if not it's positional).
    o->positional = !_cargo_is_prefix(ctx, o->name[0][0]);

    if (o->positional
        && !(o->flags & CARGO_OPT_NOT_REQUIRED)
        && (o->nargs != CARGO_NARGS_ZERO_OR_MORE)
        && (o->nargs != CARGO_NARGS_ZERO_OR_ONE))
    {
        CARGODBG(2, "Positional argument %s required by default\n", o->name[0]);
        o->flags |= CARGO_OPT_REQUIRED;
    }

    if (_cargo_validate_option_args(ctx, o))
    {
        goto fail;
    }

    // .[s]#  .[s]+  .[s]*
    if ((o->type == CARGO_STRING)
         && (o->nargs != 1)
         && (o->lenstr == 0)
         && !o->alloc)
    {
        // A list of strings with a static size is a special case:
        //   char *strs[5];
        // Since we only want to allocate memory for the individual
        // strings we parse, but not the entire list (as with):
        //   char **strs;
        // The format string for this would be ".[s]#"
        //
        // nargs != 1 && nargs != -1:
        //   So we want nargs to be set, but not to infinite (-1),
        //   this means # was used.
        // lenstr == 0:
        //   .[s#]# would mean we have something like char strs[5][15];
        // !alloc:
        //   The list is not to be allocated.

        // So in this case we are not allocating the list itself
        // since that is of a fixed size. But we want to allocate
        // each individual item string.
        o->str_alloc_items = 1;
    }

    for (i = 1; i < optcount; i++)
    {
        if (cargo_add_alias(ctx, optname_list[0], optname_list[i]))
        {
            goto fail;
        }
    }

    CARGODBG(2, " Option %s:\n", o->name[0]);
    CARGODBG(2, "   max_target_count = %lu\n", o->max_target_count);
    CARGODBG(2, "   alloc = %d\n", o->alloc);
    CARGODBG(2, "   lenstr = %lu\n", o->lenstr);
    CARGODBG(2, "   nargs = %d\n", o->nargs);
    CARGODBG(2, "   positional = %d\n", o->positional);
    CARGODBG(2, "   array = %d\n", o->array);
    CARGODBG(2, "   \n");

    ret = 0;

fail:
    if (ret < 0)
    {
        if (o)
        {
            _cargo_option_destroy(o);
            ctx->opt_count--;
        }
    }

    _cargo_xfree(&grpname);
    _cargo_xfree(&mutex_grpname);
    _cargo_free_str_list(&optname_list, &optcount);

    return ret;
}